

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

pointer __thiscall
google::protobuf::RepeatedField<bool>::Mutable(RepeatedField<bool> *this,int index)

{
  Arena *pAVar1;
  int iVar2;
  bool *pbVar3;
  void *ptr;
  RepeatedField<bool> *this_00;
  Arena *this_01;
  RepeatedField<bool> *unaff_R14;
  Arena *pAStack_40;
  Arena *pAStack_38;
  RepeatedField<bool> *pRStack_30;
  
  pAVar1 = (Arena *)(ulong)(uint)index;
  if (index < 0) {
    pRStack_30 = (RepeatedField<bool> *)0x26459d;
    Mutable();
  }
  else {
    pRStack_30 = (RepeatedField<bool> *)0x26456e;
    iVar2 = internal::SooRep::size
                      (&this->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    unaff_R14 = this;
    if (index < iVar2) {
      pRStack_30 = (RepeatedField<bool> *)0x264584;
      pbVar3 = elements(this,(undefined1  [16])
                             ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
      return pbVar3 + (long)pAVar1;
    }
  }
  pRStack_30 = (RepeatedField<bool> *)0x2645ab;
  this_01 = pAVar1;
  Mutable();
  pAStack_38 = pAVar1;
  pRStack_30 = unaff_R14;
  if (this_01 == (Arena *)0x0) {
    this_00 = (RepeatedField<bool> *)operator_new(0x10);
    RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_01,0x10);
    pAStack_40 = this_01;
    this_00 = Arena::InternalHelper<google::protobuf::RepeatedField<bool>>::
              Construct<google::protobuf::Arena*>(ptr,&pAStack_40);
  }
  return (pointer)this_00;
}

Assistant:

inline Element* RepeatedField<Element>::Mutable(int index)
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  ABSL_DCHECK_GE(index, 0);
  ABSL_DCHECK_LT(index, size());
  return &elements(is_soo())[index];
}